

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall SymmetricAlgorithm::decryptFinal(SymmetricAlgorithm *this,ByteString *param_2)

{
  size_t in_RSI;
  ByteString *in_RDI;
  bool bVar1;
  
  bVar1 = *(int *)&in_RDI[1]._vptr_ByteString == 2;
  if (bVar1) {
    (in_RDI->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
    super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)0x0;
    *(undefined4 *)
     &(in_RDI->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined1 *)
     ((long)&(in_RDI->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = 1;
    (in_RDI->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (in_RDI->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined4 *)&in_RDI[1]._vptr_ByteString = 0;
    in_RDI[1].byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
    super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)0x0;
    ByteString::wipe(in_RDI,in_RSI);
  }
  return bVar1;
}

Assistant:

bool SymmetricAlgorithm::decryptFinal(ByteString& /*data*/)
{
	if (currentOperation != DECRYPT)
	{
		return false;
	}

	currentKey = NULL;
	currentCipherMode = SymMode::Unknown;
	currentPaddingMode = true;
	currentCounterBits = 0;
	currentTagBytes = 0;
	currentOperation = NONE;
	currentBufferSize = 0;
	currentAEADBuffer.wipe();

	return true;
}